

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void ptls__key_schedule_update_hash
               (ptls_key_schedule_t *sched,uint8_t *msg,size_t msglen,int use_outer)

{
  st_ptls_hash_context_t *local_40;
  ptls_hash_context_t *ctx;
  size_t i;
  int use_outer_local;
  size_t msglen_local;
  uint8_t *msg_local;
  ptls_key_schedule_t *sched_local;
  
  for (ctx = (ptls_hash_context_t *)0x0; ctx != (ptls_hash_context_t *)sched->num_hashes;
      ctx = (ptls_hash_context_t *)((long)&ctx->update + 1)) {
    if (use_outer == 0) {
      local_40 = sched->hashes[(long)ctx].ctx;
    }
    else {
      local_40 = sched->hashes[(long)ctx].ctx_outer;
    }
    (*local_40->update)(local_40,msg,msglen);
  }
  return;
}

Assistant:

void ptls__key_schedule_update_hash(ptls_key_schedule_t *sched, const uint8_t *msg, size_t msglen, int use_outer)
{
    size_t i;

    PTLS_DEBUGF("%s:%p:len=%zu\n", __FUNCTION__, sched, msglen);
    for (i = 0; i != sched->num_hashes; ++i) {
        ptls_hash_context_t *ctx = use_outer ? sched->hashes[i].ctx_outer : sched->hashes[i].ctx;
        ctx->update(ctx, msg, msglen);
#if defined(PTLS_DEBUG) && PTLS_DEBUG
        {
            uint8_t digest[PTLS_MAX_DIGEST_SIZE];
            ctx->final(ctx, digest, PTLS_HASH_FINAL_MODE_SNAPSHOT);
            PTLS_DEBUGF("  %zu: %02x%02x%02x%02x\n", i, digest[0], digest[1], digest[2], digest[3]);
        }
#endif
    }
}